

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O0

void __thiscall
ConfidentialTxOutReference_GetSerializeSize_Test::TestBody
          (ConfidentialTxOutReference_GetSerializeSize_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  AssertHelper local_520;
  Message local_518;
  int local_50c;
  undefined1 local_508 [8];
  AssertionResult gtest_ar_14;
  Message local_4f0;
  int local_4e4;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_13;
  Message local_4c8;
  int local_4bc;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_12;
  Message local_4a0;
  uint32_t local_498 [2];
  undefined1 local_490 [8];
  AssertionResult gtest_ar_11;
  Message local_478;
  int local_46c;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_10;
  Message local_450;
  int local_444;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_9;
  Message local_428;
  int local_41c;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_8;
  Message local_400;
  uint32_t local_3f8 [2];
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_7;
  Message local_3d8;
  int local_3cc;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_6;
  Message local_3b0;
  int local_3a4;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_5;
  Message local_388;
  int local_37c;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_4;
  Message local_360;
  uint32_t local_358 [2];
  undefined1 local_350 [8];
  AssertionResult gtest_ar_3;
  int minimum_bits;
  int exponent;
  uint32_t cache_size;
  Message local_328;
  int local_31c;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_2;
  Message local_300;
  int local_2f4;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_1;
  Message local_2d8;
  int local_2d0;
  uint32_t local_2cc;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar;
  uint32_t no_wit_size;
  uint32_t wit_size;
  ConfidentialTxOutReference txout_ref;
  Amount local_1a8;
  ConfidentialValue local_198;
  undefined1 local_170 [8];
  ConfidentialTxOut txout;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  ConfidentialAssetId asset;
  int64_t satoshi;
  ConfidentialTxOutReference_GetSerializeSize_Test *this_local;
  
  asset.version_ = '@';
  asset._33_7_ = 0xf42;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_60,"1234567890123456789012345678901234567890123456789012345678901234",
             &local_61);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(asset._32_8_);
  txout_ref.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)AVar3.amount_;
  local_1a8.ignore_check_ = AVar3.ignore_check_;
  local_1a8.amount_ =
       (int64_t)txout_ref.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  cfd::core::ConfidentialValue::ConfidentialValue(&local_198,&local_1a8);
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            ((ConfidentialTxOut *)local_170,&exp_script,(ConfidentialAssetId *)local_40,&local_198);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_198);
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)&no_wit_size,(ConfidentialTxOut *)local_170);
  gtest_ar.message_.ptr_._4_4_ = 0;
  gtest_ar.message_.ptr_._0_4_ = 0;
  local_2cc = cfd::core::ConfidentialTxOutReference::GetSerializeSize
                        ((ConfidentialTxOutReference *)&no_wit_size,false,
                         (uint32_t *)((long)&gtest_ar.message_.ptr_ + 4),
                         (uint32_t *)&gtest_ar.message_,0,0x34,(uint32_t *)0x0,0);
  local_2d0 = 0x44;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_2c8,
             "txout_ref.GetSerializeSize(false, &wit_size, &no_wit_size)","68",&local_2cc,&local_2d0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x136,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  local_2f4 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_2f0,"wit_size","2",(uint *)((long)&gtest_ar.message_.ptr_ + 4)
             ,&local_2f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_300);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x137,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  local_31c = 0x42;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_318,"no_wit_size","66",(uint *)&gtest_ar.message_,&local_31c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&exponent,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x138,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&exponent,&local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&exponent);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  minimum_bits = 0;
  gtest_ar.message_.ptr_._4_4_ = 0;
  gtest_ar.message_.ptr_._0_4_ = 0;
  gtest_ar_3.message_.ptr_._4_4_ = 0x24;
  local_358[1] = 0xc69;
  local_358[0] = cfd::core::ConfidentialTxOutReference::GetSerializeSize
                           ((ConfidentialTxOutReference *)&no_wit_size,true,
                            (uint32_t *)((long)&gtest_ar.message_.ptr_ + 4),
                            (uint32_t *)&gtest_ar.message_,0,0x24,(uint32_t *)&minimum_bits,0);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_350,"3177",
             "txout_ref.GetSerializeSize(true, &wit_size, &no_wit_size, exponent, minimum_bits, &cache_size)"
             ,(int *)(local_358 + 1),local_358);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x140,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  local_37c = 0xbef;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_378,"3055","wit_size",&local_37c,
             (uint *)((long)&gtest_ar.message_.ptr_ + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x141,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  local_3a4 = 0x7a;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_3a0,"122","no_wit_size",&local_3a4,(uint *)&gtest_ar.message_)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x142,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  local_3cc = 0xb4c;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_3c8,"2892","cache_size",&local_3cc,(uint *)&minimum_bits);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x143,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  gtest_ar_3.message_.ptr_._4_4_ = 0x34;
  minimum_bits = 0;
  local_3f8[1] = 0x116a;
  local_3f8[0] = cfd::core::ConfidentialTxOutReference::GetSerializeSize
                           ((ConfidentialTxOutReference *)&no_wit_size,true,
                            (uint32_t *)((long)&gtest_ar.message_.ptr_ + 4),
                            (uint32_t *)&gtest_ar.message_,0,0x34,(uint32_t *)&minimum_bits,0x100);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_3f0,"4458",
             "txout_ref.GetSerializeSize(true, &wit_size, &no_wit_size, exponent, minimum_bits, &cache_size, 256)"
             ,(int *)(local_3f8 + 1),local_3f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x148,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  local_41c = 0x10f0;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_418,"4336","wit_size",&local_41c,
             (uint *)((long)&gtest_ar.message_.ptr_ + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x149,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  local_444 = 0x7a;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_440,"122","no_wit_size",&local_444,(uint *)&gtest_ar.message_)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_450);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x14a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  local_46c = 0x104d;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_468,"4173","cache_size",&local_46c,(uint *)&minimum_bits);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x14b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  gtest_ar_3.message_.ptr_._4_4_ = 0x34;
  minimum_bits = 0;
  local_498[1] = 0x112b;
  local_498[0] = cfd::core::ConfidentialTxOutReference::GetSerializeSize
                           ((ConfidentialTxOutReference *)&no_wit_size,true,
                            (uint32_t *)((long)&gtest_ar.message_.ptr_ + 4),
                            (uint32_t *)&gtest_ar.message_,0,0x34,(uint32_t *)&minimum_bits,2);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_490,"4395",
             "txout_ref.GetSerializeSize(true, &wit_size, &no_wit_size, exponent, minimum_bits, &cache_size, 2)"
             ,(int *)(local_498 + 1),local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(&local_4a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x150,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  local_4bc = 0x10b1;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_4b8,"4273","wit_size",&local_4bc,
             (uint *)((long)&gtest_ar.message_.ptr_ + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x151,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  local_4e4 = 0x7a;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_4e0,"122","no_wit_size",&local_4e4,(uint *)&gtest_ar.message_)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_4f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x152,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_4f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  local_50c = 0x104d;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_508,"4173","cache_size",&local_50c,(uint *)&minimum_bits);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar1) {
    testing::Message::Message(&local_518);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_508);
    testing::internal::AssertHelper::AssertHelper
              (&local_520,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x153,pcVar2);
    testing::internal::AssertHelper::operator=(&local_520,&local_518);
    testing::internal::AssertHelper::~AssertHelper(&local_520);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)&no_wit_size);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)local_170);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_40);
  return;
}

Assistant:

TEST(ConfidentialTxOutReference, GetSerializeSize) {
  {
    int64_t satoshi = 1000000;
    ConfidentialAssetId asset("1234567890123456789012345678901234567890123456789012345678901234");
    ConfidentialTxOut txout(exp_script, asset,
        ConfidentialValue(Amount::CreateBySatoshiAmount(satoshi)));
    ConfidentialTxOutReference txout_ref(txout);

    uint32_t wit_size = 0;
    uint32_t no_wit_size = 0;
    EXPECT_EQ(txout_ref.GetSerializeSize(false, &wit_size, &no_wit_size), 68);
    EXPECT_EQ(wit_size, 2);
    EXPECT_EQ(no_wit_size, 66);

    uint32_t cache_size = 0;
    wit_size = 0;
    no_wit_size = 0;
    int exponent = 0;
    int minimum_bits = 36;
    EXPECT_EQ(3177,
        txout_ref.GetSerializeSize(true, &wit_size, &no_wit_size, exponent, minimum_bits, &cache_size));
    EXPECT_EQ(3055, wit_size);
    EXPECT_EQ(122, no_wit_size);
    EXPECT_EQ(2892, cache_size);

    minimum_bits = 52;
    cache_size = 0;
    EXPECT_EQ(4458,
        txout_ref.GetSerializeSize(true, &wit_size, &no_wit_size, exponent, minimum_bits, &cache_size, 256));
    EXPECT_EQ(4336, wit_size);
    EXPECT_EQ(122, no_wit_size);
    EXPECT_EQ(4173, cache_size);

    minimum_bits = 52;
    cache_size = 0;
    EXPECT_EQ(4395,
        txout_ref.GetSerializeSize(true, &wit_size, &no_wit_size, exponent, minimum_bits, &cache_size, 2));
    EXPECT_EQ(4273, wit_size);
    EXPECT_EQ(122, no_wit_size);
    EXPECT_EQ(4173, cache_size);
  }
}